

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O2

SizedPtr google::protobuf::internal::AllocateAtLeast(size_t size)

{
  void *pvVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  SizedPtr SVar3;
  
  if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
    pvVar1 = operator_new(size);
  }
  else {
    auVar2 = (**(code **)(in_FS_OFFSET + -0x48))(size,*(undefined8 *)(in_FS_OFFSET + -0x40));
    size = auVar2._8_8_;
    pvVar1 = auVar2._0_8_;
  }
  SVar3.n = size;
  SVar3.p = pvVar1;
  return SVar3;
}

Assistant:

inline SizedPtr AllocateAtLeast(size_t size) {
#if !defined(NDEBUG) && defined(ABSL_HAVE_THREAD_LOCAL) && \
    defined(__cpp_inline_variables)
  if (allocate_at_least_hook != nullptr) {
    return allocate_at_least_hook(size, allocate_at_least_hook_context);
  }
#endif  // !NDEBUG && ABSL_HAVE_THREAD_LOCAL && __cpp_inline_variables
  return {::operator new(size), size};
}